

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O2

bool __thiscall cmGeneratedFileStreamBase::Close(cmGeneratedFileStreamBase *this)

{
  bool bVar1;
  int iVar2;
  cmGeneratedFileStreamBase *this_00;
  string resname;
  string gzname;
  string sStack_58;
  
  std::__cxx11::string::string((string *)&sStack_58,(string *)this);
  if ((this->Compress == true) && (this->CompressExtraExtension == true)) {
    std::__cxx11::string::append((char *)&sStack_58);
  }
  if (((this->Name)._M_string_length == 0) || (this->Okay != true)) {
LAB_00226f75:
    bVar1 = false;
  }
  else {
    if (this->CopyIfDifferent == true) {
      bVar1 = cmsys::SystemTools::FilesDiffer(&this->TempName,&sStack_58);
      if (!bVar1) goto LAB_00226f75;
    }
    if (this->Compress == true) {
      this_00 = (cmGeneratedFileStreamBase *)&stack0xffffffffffffffc8;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                     &this->TempName,".temp.gz");
      iVar2 = CompressFile(this_00,&this->TempName,(string *)&stack0xffffffffffffffc8);
      if (iVar2 != 0) {
        cmSystemTools::RenameFile((string *)&stack0xffffffffffffffc8,&sStack_58);
      }
      cmsys::SystemTools::RemoveFile((string *)&stack0xffffffffffffffc8);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
      bVar1 = true;
    }
    else {
      bVar1 = true;
      cmSystemTools::RenameFile(&this->TempName,&sStack_58);
    }
  }
  cmsys::SystemTools::RemoveFile(&this->TempName);
  std::__cxx11::string::~string((string *)&sStack_58);
  return bVar1;
}

Assistant:

bool cmGeneratedFileStreamBase::Close()
{
  bool replaced = false;

  std::string resname = this->Name;
  if (this->Compress && this->CompressExtraExtension) {
    resname += ".gz";
  }

  // Only consider replacing the destination file if no error
  // occurred.
  if (!this->Name.empty() && this->Okay &&
      (!this->CopyIfDifferent ||
       cmSystemTools::FilesDiffer(this->TempName, resname))) {
    // The destination is to be replaced.  Rename the temporary to the
    // destination atomically.
    if (this->Compress) {
      std::string gzname = this->TempName + ".temp.gz";
      if (this->CompressFile(this->TempName, gzname)) {
        this->RenameFile(gzname, resname);
      }
      cmSystemTools::RemoveFile(gzname);
    } else {
      this->RenameFile(this->TempName, resname);
    }

    replaced = true;
  }

  // Else, the destination was not replaced.
  //
  // Always delete the temporary file. We never want it to stay around.
  cmSystemTools::RemoveFile(this->TempName);

  return replaced;
}